

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizingSolver.cpp
# Opt level: O3

void __thiscall SAT::MinimizingSolver::MinimizingSolver(MinimizingSolver *this,SATSolver *inner)

{
  (this->super_SATSolver)._vptr_SATSolver = (_func_int **)&PTR__MinimizingSolver_00b3e8c8;
  this->_varCnt = 0;
  (this->_inner)._obj = inner;
  this->_assignmentValid = false;
  (this->_unprocessed)._capacity = 0;
  (this->_unprocessed)._stack = (SATClause **)0x0;
  (this->_unprocessed)._cursor = (SATClause **)0x0;
  (this->_unprocessed)._end = (SATClause **)0x0;
  (this->_asgn)._size = 0;
  (this->_asgn)._capacity = 0;
  (this->_asgn)._array = (bool *)0x0;
  (this->_watcher)._size = 0;
  (this->_watcher)._capacity = 0;
  (this->_watcher)._array = (Stack<SAT::SATClause_*> *)0x0;
  (this->_unsClCnt)._size = 0;
  (this->_unsClCnt)._capacity = 0;
  (this->_unsClCnt)._array = (uint *)0x0;
  Lib::
  DynamicHeap<unsigned_int,_SAT::MinimizingSolver::CntComparator,_Lib::ArrayMap<unsigned_long>,_unsigned_int>
  ::DynamicHeap(&this->_heap,(CntComparator)&this->_unsClCnt);
  (this->_clIdx)._size = 0;
  (this->_clIdx)._capacity = 0;
  (this->_clIdx)._array = (Stack<SAT::SATClause_*> *)0x0;
  (this->_satisfiedClauses)._map._timestamp = 1;
  (this->_satisfiedClauses)._map._size = 0;
  (this->_satisfiedClauses)._map._deleted = 0;
  (this->_satisfiedClauses)._map._capacityIndex = 0;
  (this->_satisfiedClauses)._map._capacity = 0;
  *(undefined8 *)&(this->_satisfiedClauses)._map._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_satisfiedClauses)._map._entries + 4) = 0;
  *(undefined4 *)((long)&(this->_satisfiedClauses)._map._afterLast + 4) = 0;
  return;
}

Assistant:

MinimizingSolver::MinimizingSolver(SATSolver* inner)
 : _varCnt(0), _inner(inner), _assignmentValid(false), _heap(CntComparator(_unsClCnt))
{
}